

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normal_distribution.hpp
# Opt level: O2

result_type __thiscall
boost::random::normal_distribution<double>::operator()
          (normal_distribution<double> *this,
          linear_congruential_engine<unsigned_int,_48271U,_0U,_2147483647U> *eng)

{
  undefined1 auVar1 [16];
  double dVar2;
  result_type rVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  new_uniform_01<double> local_1a;
  new_uniform_01<double> local_19;
  double local_18;
  
  if (this->_valid == false) {
    rVar3 = detail::new_uniform_01<double>::operator()(&local_19,eng);
    this->_r1 = rVar3;
    rVar3 = detail::new_uniform_01<double>::operator()(&local_1a,eng);
    this->_r2 = rVar3;
    dVar2 = log(1.0 - rVar3);
    dVar2 = dVar2 * -2.0;
    if (dVar2 < 0.0) {
      local_18 = sqrt(dVar2);
    }
    else {
      auVar4._8_8_ = 0;
      auVar4._0_8_ = dVar2;
      auVar4 = vsqrtsd_avx(auVar4,auVar4);
      local_18 = auVar4._0_8_;
    }
    this->_cached_rho = local_18;
    this->_valid = true;
    dVar2 = cos(this->_r1 * 6.283185307179586);
  }
  else {
    this->_valid = false;
    local_18 = this->_cached_rho;
    dVar2 = sin(this->_r1 * 6.283185307179586);
  }
  auVar5._8_8_ = 0;
  auVar5._0_8_ = this->_sigma;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = this->_mean;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = dVar2 * local_18;
  auVar4 = vfmadd213sd_fma(auVar5,auVar6,auVar1);
  return auVar4._0_8_;
}

Assistant:

result_type operator()(Engine& eng)
    {
        using std::sqrt;
        using std::log;
        using std::sin;
        using std::cos;

        if(!_valid) {
            _r1 = boost::uniform_01<RealType>()(eng);
            _r2 = boost::uniform_01<RealType>()(eng);
            _cached_rho = sqrt(-result_type(2) * log(result_type(1)-_r2));
            _valid = true;
        } else {
            _valid = false;
        }
        // Can we have a boost::mathconst please?
        const result_type pi = result_type(3.14159265358979323846);

        return _cached_rho * (_valid ?
                              cos(result_type(2)*pi*_r1) :
                              sin(result_type(2)*pi*_r1))
            * _sigma + _mean;
    }